

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values.h
# Opt level: O0

void __thiscall mpt::value_store::~value_store(value_store *this)

{
  value_store *this_local;
  
  array::~array(&this->_d);
  return;
}

Assistant:

MPT_STRUCT(value_store)
{
#ifdef __cplusplus
public:
	enum Flags {
		ValueChange = 1
	};
	inline value_store() : _type(0), _flags(0)
	{ }
	buffer *reserve(long , const struct type_traits &);
	void set_modified(bool mod = true);
	long element_count() const;
	
	inline int flags() const
	{
		return _flags;
	}
	inline int type() const
	{
		return _type;
	}
	inline const array::content *data() const
	{
		return _d.data();
	}
	template <typename T>
	T *set(const span<const T> &data, long pos = 0)
	{
		static const struct type_traits *traits = 0;
		if (!traits && !(traits = type_properties<T>::traits())) {
			return 0;
		}
		void *ptr = set(*traits, data.size() * sizeof(T), data.begin(), pos);
		if (ptr) {
			/* type ID registration may take place during runtime */
			int type = type_properties<T>::id(false);
			_type = (type > 0) ? type : 0;
		}
		return static_cast<T *>(ptr);
	}
	template <typename T>
	content<T> *reserve(long count = 0)
	{
		static const struct type_traits *traits = 0;
		if (!traits && !(traits = type_properties<T>::traits())) {
			return 0;
		}
		buffer *buf = reserve(count, *traits);
		if (buf) {
			/* type ID registration may take place during runtime */
			int type = type_properties<T>::id(false);
			_type = (type > 0) ? type : 0;
		}
		return static_cast<content<T>*>(buf);
	}
protected:
	void *set(const struct type_traits &, size_t , const void *, long = 0);
#else
# define MPT_VALUE_STORE_INIT { MPT_ARRAY_INIT, 0, 0 }
#endif
	MPT_STRUCT(array) _d;
	uint16_t _type;
	uint8_t  _flags;
}